

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_dratio_dnode0
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  double dVar1;
  REF_DBL RVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_1a0;
  double local_198;
  double local_188;
  double local_180;
  double local_170;
  double local_168;
  double local_158;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL r_log_r;
  REF_DBL RStack_f8;
  REF_INT i;
  REF_DBL d_r_max [3];
  REF_DBL r_max;
  REF_DBL d_r_min [3];
  REF_DBL r_min;
  REF_DBL d_r [3];
  REF_DBL r;
  REF_DBL d_ratio1 [3];
  REF_DBL ratio1;
  REF_DBL d_ratio0 [3];
  double local_58;
  REF_DBL ratio0;
  REF_DBL length;
  REF_DBL direction [3];
  REF_DBL *d_ratio_local;
  REF_DBL *ratio_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  direction[2] = (REF_DBL)d_ratio;
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->global[node0] < 0)) ||
      ((node1 < 0 || (ref_node->max <= node1)))) || (ref_node->global[node1] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x5f0,
           "ref_node_dratio_dnode0",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    length = ref_node->real[node1 * 0xf] - ref_node->real[node0 * 0xf];
    direction[0] = ref_node->real[node1 * 0xf + 1] - ref_node->real[node0 * 0xf + 1];
    direction[1] = ref_node->real[node1 * 0xf + 2] - ref_node->real[node0 * 0xf + 2];
    ratio0 = direction[1] * direction[1] + length * length + direction[0] * direction[0];
    ratio0 = sqrt(ratio0);
    if (ratio0 * 1e+20 <= 0.0) {
      local_158 = -(ratio0 * 1e+20);
    }
    else {
      local_158 = ratio0 * 1e+20;
    }
    if (length <= 0.0) {
      local_168 = -length;
    }
    else {
      local_168 = length;
    }
    if (local_168 < local_158) {
      if (ratio0 * 1e+20 <= 0.0) {
        local_170 = -(ratio0 * 1e+20);
      }
      else {
        local_170 = ratio0 * 1e+20;
      }
      if (direction[0] <= 0.0) {
        local_180 = -direction[0];
      }
      else {
        local_180 = direction[0];
      }
      if (local_180 < local_170) {
        if (ratio0 * 1e+20 <= 0.0) {
          local_188 = -(ratio0 * 1e+20);
        }
        else {
          local_188 = ratio0 * 1e+20;
        }
        if (direction[1] <= 0.0) {
          local_198 = -direction[1];
        }
        else {
          local_198 = direction[1];
        }
        if (local_198 < local_188) {
          if (ref_node->ratio_method == 2) {
            uVar3 = ref_node_dratio_dnode0_quadrature
                              (ref_node,node0,node1,ratio,(REF_DBL *)direction[2]);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x609,"ref_node_dratio_dnode0",(ulong)uVar3,"dratio quad");
              return uVar3;
            }
            return 0;
          }
          uVar3 = ref_node_metric_get(ref_node,node0,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x60d,"ref_node_dratio_dnode0",(ulong)uVar3,"node0 m");
            return uVar3;
          }
          uVar3 = ref_matrix_sqrt_vt_m_v_deriv
                            ((REF_DBL *)&ref_private_macro_code_rss_1,&length,&local_58,&ratio1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x60e,"ref_node_dratio_dnode0",(ulong)uVar3,"vt m v0");
            return uVar3;
          }
          for (r_log_r._4_4_ = 0; r_log_r._4_4_ < 3; r_log_r._4_4_ = r_log_r._4_4_ + 1) {
            d_ratio0[(long)r_log_r._4_4_ + -1] = -d_ratio0[(long)r_log_r._4_4_ + -1];
          }
          uVar3 = ref_node_metric_get(ref_node,node1,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x610,"ref_node_dratio_dnode0",(ulong)uVar3,"node1 m");
            return uVar3;
          }
          uVar3 = ref_matrix_sqrt_vt_m_v_deriv
                            ((REF_DBL *)&ref_private_macro_code_rss_1,&length,d_ratio1 + 2,&r);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x611,"ref_node_dratio_dnode0",(ulong)uVar3,"vt m v0");
            return uVar3;
          }
          for (r_log_r._4_4_ = 0; r_log_r._4_4_ < 3; r_log_r._4_4_ = r_log_r._4_4_ + 1) {
            d_ratio1[(long)r_log_r._4_4_ + -1] = -d_ratio1[(long)r_log_r._4_4_ + -1];
          }
          if ((1e-12 <= local_58) && (1e-12 <= d_ratio1[2])) {
            if (d_ratio1[2] <= local_58) {
              d_r_min[2] = d_ratio1[2];
              d_r_min[0] = d_ratio1[0];
              d_r_min[1] = d_ratio1[1];
              d_r_max[2] = local_58;
              RStack_f8 = ratio1;
              d_r_max[0] = d_ratio0[0];
              d_r_max[1] = d_ratio0[1];
            }
            else {
              d_r_min[2] = local_58;
              d_r_min[0] = d_ratio0[0];
              d_r_min[1] = d_ratio0[1];
              d_r_max[2] = d_ratio1[2];
              RStack_f8 = r;
              d_r_max[0] = d_ratio1[0];
              d_r_max[1] = d_ratio1[1];
            }
            dVar4 = d_r_min[2] / d_r_max[2];
            d_r[2] = dVar4;
            for (r_log_r._4_4_ = 0; r_log_r._4_4_ < 3; r_log_r._4_4_ = r_log_r._4_4_ + 1) {
              d_r[(long)r_log_r._4_4_ + -1] =
                   ((d_r_min[(long)r_log_r._4_4_ + -1] * d_r_max[2] +
                    -(d_r_min[2] *
                     *(double *)((long)&stack0xffffffffffffff08 + (long)r_log_r._4_4_ * 8))) /
                   d_r_max[2]) / d_r_max[2];
            }
            if (dVar4 - 1.0 <= 0.0) {
              local_1a0 = -(dVar4 - 1.0);
            }
            else {
              local_1a0 = dVar4 - 1.0;
            }
            if (local_1a0 < 1e-12) {
              *ratio = (d_r_min[2] + d_r_max[2]) * 0.5;
              for (r_log_r._4_4_ = 0; r_log_r._4_4_ < 3; r_log_r._4_4_ = r_log_r._4_4_ + 1) {
                *(double *)((long)direction[2] + (long)r_log_r._4_4_ * 8) =
                     (d_r_min[(long)r_log_r._4_4_ + -1] +
                     *(double *)((long)&stack0xffffffffffffff08 + (long)r_log_r._4_4_ * 8)) * 0.5;
              }
              return 0;
            }
            dVar5 = log(dVar4);
            m[5] = dVar4 * dVar5;
            *ratio = (d_r_min[2] * (d_r[2] - 1.0)) / m[5];
            for (r_log_r._4_4_ = 0; RVar2 = m[5], r_log_r._4_4_ < 3;
                r_log_r._4_4_ = r_log_r._4_4_ + 1) {
              dVar4 = d_r_min[(long)r_log_r._4_4_ + -1];
              dVar10 = d_r[2] - 1.0;
              dVar6 = d_r_min[2] * d_r[(long)r_log_r._4_4_ + -1];
              dVar7 = d_r_min[2] * (d_r[2] - 1.0);
              dVar8 = (d_r[2] * 1.0) / d_r[2];
              dVar5 = d_r[(long)r_log_r._4_4_ + -1];
              dVar1 = d_r[(long)r_log_r._4_4_ + -1];
              dVar9 = log(d_r[2]);
              *(double *)((long)direction[2] + (long)r_log_r._4_4_ * 8) =
                   (((dVar6 + dVar4 * dVar10) * RVar2 + -(dVar7 * (dVar8 * dVar5 + dVar1 * dVar9)))
                   / m[5]) / m[5];
            }
            return 0;
          }
          if (d_ratio1[2] <= local_58) {
            *ratio = d_ratio1[2];
            *(REF_DBL *)direction[2] = r;
            *(REF_DBL *)((long)direction[2] + 8) = d_ratio1[0];
            *(REF_DBL *)((long)direction[2] + 0x10) = d_ratio1[1];
          }
          else {
            *ratio = local_58;
            *(REF_DBL *)direction[2] = ratio1;
            *(REF_DBL *)((long)direction[2] + 8) = d_ratio0[0];
            *(REF_DBL *)((long)direction[2] + 0x10) = d_ratio0[1];
          }
          return 0;
        }
      }
    }
    *ratio = 0.0;
    *(undefined8 *)direction[2] = 0;
    *(undefined8 *)((long)direction[2] + 8) = 0;
    *(undefined8 *)((long)direction[2] + 0x10) = 0;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_dratio_dnode0(REF_NODE ref_node, REF_INT node0,
                                          REF_INT node1, REF_DBL *ratio,
                                          REF_DBL *d_ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, d_ratio0[3], ratio1, d_ratio1[3];
  REF_DBL r, d_r[3], r_min, d_r_min[3], r_max, d_r_max[3];
  REF_INT i;
  REF_DBL r_log_r;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    d_ratio[0] = 0.0;
    d_ratio[1] = 0.0;
    d_ratio[2] = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_dratio_dnode0_quadrature(ref_node, node0, node1, ratio,
                                          d_ratio),
        "dratio quad");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio0, d_ratio0), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio0[i] = -d_ratio0[i]; /* node 0 is neg */
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio1, d_ratio1), "vt m v0");
  for (i = 0; i < 3; i++) d_ratio1[i] = -d_ratio1[i]; /* node 0 is neg */

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    if (ratio0 < ratio1) {
      *ratio = ratio0;
      d_ratio[0] = d_ratio0[0];
      d_ratio[1] = d_ratio0[1];
      d_ratio[2] = d_ratio0[2];
    } else {
      *ratio = ratio1;
      d_ratio[0] = d_ratio1[0];
      d_ratio[1] = d_ratio1[1];
      d_ratio[2] = d_ratio1[2];
    }
    return REF_SUCCESS;
  }

  if (ratio0 < ratio1) {
    r_min = ratio0;
    d_r_min[0] = d_ratio0[0];
    d_r_min[1] = d_ratio0[1];
    d_r_min[2] = d_ratio0[2];
    r_max = ratio1;
    d_r_max[0] = d_ratio1[0];
    d_r_max[1] = d_ratio1[1];
    d_r_max[2] = d_ratio1[2];
  } else {
    r_min = ratio1;
    d_r_min[0] = d_ratio1[0];
    d_r_min[1] = d_ratio1[1];
    d_r_min[2] = d_ratio1[2];
    r_max = ratio0;
    d_r_max[0] = d_ratio0[0];
    d_r_max[1] = d_ratio0[1];
    d_r_max[2] = d_ratio0[2];
  }

  r = r_min / r_max;
  for (i = 0; i < 3; i++)
    d_r[i] = (d_r_min[i] * r_max - r_min * d_r_max[i]) / r_max / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (r_min + r_max);
    for (i = 0; i < 3; i++) d_ratio[i] = 0.5 * (d_r_min[i] + d_r_max[i]);
    return REF_SUCCESS;
  }

  r_log_r = r * log(r);
  *ratio = r_min * (r - 1.0) / r_log_r;

  for (i = 0; i < 3; i++)
    d_ratio[i] = ((r_min * d_r[i] + d_r_min[i] * (r - 1.0)) * r_log_r -
                  r_min * (r - 1.0) * (r * 1 / r * d_r[i] + d_r[i] * log(r))) /
                 r_log_r / r_log_r;

  return REF_SUCCESS;
}